

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
NumericArgTest_MakeAndVisit_Test<unsigned_int>::TestBody
          (NumericArgTest_MakeAndVisit_Test<unsigned_int> *this)

{
  MockSpec<test_result_(unsigned_int)> *this_00;
  StrictMock<mock_visitor<unsigned_int>_> *pSVar1;
  StrictMock<mock_visitor<unsigned_int>_> visitor_5;
  StrictMock<mock_visitor<unsigned_int>_> visitor_4;
  Type_conflict1 expected_2;
  StrictMock<mock_visitor<unsigned_int>_> visitor_3;
  StrictMock<mock_visitor<unsigned_int>_> visitor_2;
  Type_conflict1 expected_1;
  StrictMock<mock_visitor<unsigned_int>_> visitor_1;
  StrictMock<mock_visitor<unsigned_int>_> visitor;
  Type_conflict1 expected;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffff908;
  StrictMock<mock_visitor<unsigned_int>_> *in_stack_fffffffffffff910;
  StrictMock<mock_visitor<unsigned_int>_> *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  uint uVar2;
  Matcher<unsigned_int> *in_stack_fffffffffffff940;
  char *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa14;
  char *in_stack_fffffffffffffa18;
  MockSpec<test_result_(unsigned_int)> *in_stack_fffffffffffffa20;
  undefined1 local_410 [196];
  uint local_34c;
  uint local_244;
  type_conflict2 local_23c;
  type_conflict2 local_12c;
  type_conflict2 local_c;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_c = test_value<unsigned_int>();
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<unsigned_int>::Matcher(in_stack_fffffffffffff940,uVar2);
  mock_visitor<unsigned_int>::gmock_visit
            ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
             (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14dfc7);
  local_12c = test_value<unsigned_int>();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
            ((uint *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<unsigned_int>::Matcher(in_stack_fffffffffffff940,uVar2);
  mock_visitor<unsigned_int>::gmock_visit
            ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
             (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14e094);
  local_23c = test_value<unsigned_int>();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,unsigned_int>
            ((uint *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  local_244 = std::numeric_limits<unsigned_int>::min();
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<unsigned_int>::Matcher(in_stack_fffffffffffff940,uVar2);
  this_00 = mock_visitor<unsigned_int>::gmock_visit
                      ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
                       (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14e16d);
  local_34c = std::numeric_limits<unsigned_int>::min();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
            ((uint *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  uVar2 = (uint)((ulong)local_410 >> 0x20);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)this_00,uVar2);
  pSVar1 = (StrictMock<mock_visitor<unsigned_int>_> *)
           mock_visitor<unsigned_int>::gmock_visit
                     ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
                      (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14e230);
  std::numeric_limits<unsigned_int>::min();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,unsigned_int>
            ((uint *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  std::numeric_limits<unsigned_int>::max();
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(pSVar1);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)this_00,uVar2);
  mock_visitor<unsigned_int>::gmock_visit
            ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
             (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14e2ff);
  std::numeric_limits<unsigned_int>::max();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
            ((uint *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(pSVar1);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)this_00,uVar2);
  pSVar1 = (StrictMock<mock_visitor<unsigned_int>_> *)
           mock_visitor<unsigned_int>::gmock_visit
                     ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
                      (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14e3c2);
  std::numeric_limits<unsigned_int>::max();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,unsigned_int>
            ((uint *)pSVar1);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (pSVar1,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(pSVar1);
  return;
}

Assistant:

TYPED_TEST(NumericArgTest, MakeAndVisit) {
  CHECK_ARG(test_value<TypeParam>(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::min(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::max(), typename);
}